

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::SoftPrintPolicyDomainElement_abi_cxx11_(PlanningUnitMADPDiscrete *this)

{
  Index in_ECX;
  Index in_EDX;
  long in_RSI;
  PolicyDomainCategory in_R8D;
  
  SoftPrintPolicyDomainElement_abi_cxx11_
            ((string *)this,(PlanningUnitMADPDiscrete *)(in_RSI + -0x28),in_EDX,in_ECX,in_R8D);
  return;
}

Assistant:

string PlanningUnitMADPDiscrete::SoftPrintPolicyDomainElement(
    Index agentI, Index dI, PolicyGlobals::PolicyDomainCategory cat ) const
{
    switch ( cat )
    {
    case PolicyGlobals::OHIST_INDEX :
        {
            string s = SoftPrintObservationHistory(agentI, dI);
            return s;


            break;
        }
    case PolicyGlobals::AOHIST_INDEX :
        return GetActionObservationHistoryTree(agentI,dI)->
            GetActionObservationHistory()->SoftPrint();
        break;
    case PolicyGlobals::TYPE_INDEX : 
        throw(E("SoftPrintPolicyDomain: types are not a valid policy domain for a PlanningUnitMADPDiscrete"));
        break;
    default:
        throw(E("SoftPrintPolicyDomain: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"));
        break;
    }
    return("IMPOSSIBLE!");
}